

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmwindow.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmWindow::resetSurface(QEglFSKmsGbmWindow *this)

{
  long *plVar1;
  bool bVar2;
  QEglFSScreen *this_00;
  EGLDisplay pvVar3;
  long lVar4;
  gbm_surface *pgVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  const_pointer piVar9;
  long *in_RDI;
  long in_FS_OFFSET;
  char *extensions;
  PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC createPlatformWindowSurface;
  EGLDisplay display;
  QEglFSKmsGbmScreen *gbmScreen;
  QVector<EGLint> contextAttributes;
  QSurfaceFormat platformFormat;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff08;
  parameter_type in_stack_ffffffffffffff0c;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  QMessageLogger *in_stack_ffffffffffffff20;
  long lVar10;
  code *local_b8;
  EGLConfig in_stack_ffffffffffffff68;
  QEglFSKmsGbmScreen *in_stack_ffffffffffffff70;
  char local_78 [32];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  QSurfaceFormat local_40 [8];
  QSurfaceFormat local_38 [8];
  undefined8 local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QEglFSScreen *)(**(code **)(*in_RDI + 0x18))();
  pvVar3 = QEglFSScreen::display(this_00);
  local_30 = 0xaaaaaaaaaaaaaaaa;
  plVar1 = (long *)in_RDI[0xc];
  QPlatformWindow::window();
  QWindow::requestedFormat();
  (**(code **)(*plVar1 + 0x90))(&local_30,plVar1,local_38);
  QSurfaceFormat::~QSurfaceFormat(local_38);
  lVar4 = QEglFSDeviceIntegration::chooseConfig(pvVar3,(QSurfaceFormat *)&local_30);
  in_RDI[9] = lVar4;
  q_glFormatFromConfig(local_40,pvVar3,(QSurfaceFormat *)in_RDI[9]);
  QSurfaceFormat::operator=((QSurfaceFormat *)(in_RDI + 10),local_40);
  QSurfaceFormat::~QSurfaceFormat(local_40);
  pgVar5 = QEglFSKmsGbmScreen::createSurface(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI[8] = (long)pgVar5;
  local_b8 = (code *)0x0;
  pcVar6 = (char *)eglQueryString(0,0x3055);
  if ((pcVar6 != (char *)0x0) &&
     ((pcVar7 = strstr(pcVar6,"EGL_KHR_platform_gbm"), pcVar7 != (char *)0x0 ||
      (pcVar6 = strstr(pcVar6,"EGL_MESA_platform_gbm"), pcVar6 != (char *)0x0)))) {
    local_b8 = (code *)eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT");
  }
  if (local_b8 == (code *)0x0) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_95802::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_stack_ffffffffffffff10,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_95802::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x121f3b);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char *)0x121f51);
      QMessageLogger::debug
                (&stack0xffffffffffffff68,
                 "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface"
                );
      local_20 = local_20 & 0xffffffffffffff00;
    }
    lVar4 = eglCreateWindowSurface(pvVar3,in_RDI[9],in_RDI[8],0);
    in_RDI[7] = lVar4;
  }
  else {
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x121d69);
    uVar8 = QSurfaceFormat::testOption((FormatOption)&local_30);
    if ((uVar8 & 1) != 0) {
      uVar8 = q_hasEglExtension(pvVar3,"EGL_EXT_protected_content");
      if ((uVar8 & 1) == 0) {
        QSurfaceFormat::setOption((int)in_RDI + 0x50,true);
      }
      else {
        QList<int>::append((QList<int> *)0x121db0,in_stack_ffffffffffffff0c);
        QList<int>::append((QList<int> *)0x121dc2,in_stack_ffffffffffffff0c);
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::qLcEglfsKmsDebug();
        anon_unknown.dwarf_95802::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  (in_stack_ffffffffffffff10,
                   (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                  );
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
          anon_unknown.dwarf_95802::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x121e15);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (char *)0x121e2e);
          QMessageLogger::debug
                    (local_78,
                     "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
          local_10 = local_10 & 0xffffffffffffff00;
        }
      }
    }
    QList<int>::append((QList<int> *)0x121e79,in_stack_ffffffffffffff0c);
    lVar4 = in_RDI[9];
    lVar10 = in_RDI[8];
    piVar9 = QList<int>::constData((QList<int> *)0x121eb1);
    lVar4 = (*local_b8)(pvVar3,lVar4,lVar10,piVar9);
    in_RDI[7] = lVar4;
    QList<int>::~QList((QList<int> *)0x121ee3);
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmWindow::resetSurface()
{
    QEglFSKmsGbmScreen *gbmScreen = static_cast<QEglFSKmsGbmScreen *>(screen());
    EGLDisplay display = gbmScreen->display();
    QSurfaceFormat platformFormat = m_integration->surfaceFormatFor(window()->requestedFormat());
    m_config = QEglFSDeviceIntegration::chooseConfig(display, platformFormat);
    m_format = q_glFormatFromConfig(display, m_config, platformFormat);
    // One fullscreen window per screen -> the native window is simply the gbm_surface the screen created.
    m_window = reinterpret_cast<EGLNativeWindowType>(gbmScreen->createSurface(m_config));

    PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC createPlatformWindowSurface = nullptr;
    const char *extensions = eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
    if (extensions && (strstr(extensions, "EGL_KHR_platform_gbm") || strstr(extensions, "EGL_MESA_platform_gbm"))) {
        createPlatformWindowSurface = reinterpret_cast<PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC>(
            eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT"));
    }

    if (createPlatformWindowSurface) {
        QVector<EGLint> contextAttributes;
#ifdef EGL_EXT_protected_content
        if (platformFormat.testOption(QSurfaceFormat::ProtectedContent)) {
            if (q_hasEglExtension(display, "EGL_EXT_protected_content")) {
                contextAttributes.append(EGL_PROTECTED_CONTENT_EXT);
                contextAttributes.append(EGL_TRUE);
                qCDebug(qLcEglfsKmsDebug, "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
            } else {
                m_format.setOption(QSurfaceFormat::ProtectedContent, false);
            }
        }
#endif
        contextAttributes.append(EGL_NONE);

        m_surface = createPlatformWindowSurface(display, m_config, reinterpret_cast<void *>(m_window), contextAttributes.constData());
    } else {
        qCDebug(qLcEglfsKmsDebug, "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface");
        m_surface = eglCreateWindowSurface(display, m_config, m_window, nullptr);
    }
}